

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# menu.cpp
# Opt level: O0

void M_Ticker(void)

{
  int iVar1;
  uint local_c;
  int i;
  
  DMenu::MenuTime = DMenu::MenuTime + 1;
  if ((DMenu::CurrentMenu != (DMenu *)0x0) && (menuactive != MENU_Off)) {
    (*(DMenu::CurrentMenu->super_DObject)._vptr_DObject[9])();
    for (local_c = 0; (int)local_c < 9; local_c = local_c + 1) {
      if (((MenuButtons[(int)local_c].bDown != '\0') && (0 < MenuButtonTickers[(int)local_c])) &&
         (iVar1 = MenuButtonTickers[(int)local_c], MenuButtonTickers[(int)local_c] = iVar1 + -1,
         iVar1 + -1 < 1)) {
        MenuButtonTickers[(int)local_c] = 3;
        (*(DMenu::CurrentMenu->super_DObject)._vptr_DObject[8])
                  (DMenu::CurrentMenu,(ulong)local_c,(ulong)MenuButtonOrigin[(int)local_c] & 1);
      }
    }
    if (BackbuttonTime < 1) {
      if (0.0 < BackbuttonAlpha) {
        BackbuttonAlpha = BackbuttonAlpha - 0.1;
      }
      if (BackbuttonAlpha < 0.0) {
        BackbuttonAlpha = 0.0;
      }
    }
    else {
      if (BackbuttonAlpha < 1.0) {
        BackbuttonAlpha = BackbuttonAlpha + 0.1;
      }
      if (1.0 < BackbuttonAlpha) {
        BackbuttonAlpha = 1.0;
      }
      BackbuttonTime = BackbuttonTime + -1;
    }
  }
  return;
}

Assistant:

void M_Ticker (void) 
{
	DMenu::MenuTime++;
	if (DMenu::CurrentMenu != NULL && menuactive != MENU_Off) 
	{
		DMenu::CurrentMenu->Ticker();

		for (int i = 0; i < NUM_MKEYS; ++i)
		{
			if (MenuButtons[i].bDown)
			{
				if (MenuButtonTickers[i] > 0 &&	--MenuButtonTickers[i] <= 0)
				{
					MenuButtonTickers[i] = KEY_REPEAT_RATE;
					DMenu::CurrentMenu->MenuEvent(i, MenuButtonOrigin[i]);
				}
			}
		}
		if (BackbuttonTime > 0)
		{
			if (BackbuttonAlpha < 1.f) BackbuttonAlpha += .1f;
			if (BackbuttonAlpha > 1.f) BackbuttonAlpha = 1.f;
			BackbuttonTime--;
		}
		else
		{
			if (BackbuttonAlpha > 0) BackbuttonAlpha -= .1f;
			if (BackbuttonAlpha < 0) BackbuttonAlpha = 0;
		}
	}
}